

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::checkArgType<slang::ast::EvalContext>
               (EvalContext *context,Expression *arg,char spec,SourceRange range)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  bool bVar1;
  char cVar2;
  bitwidth_t bVar3;
  Diagnostic *in_RCX;
  long in_RSI;
  SourceLocation in_R8;
  Type *type;
  Diagnostic *in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation SVar4;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  SourceLocation in_stack_ffffffffffffffa0;
  SourceLocation in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  DiagCode code;
  Type *in_stack_ffffffffffffffb8;
  
  code = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff50);
  if (bVar1) {
    return false;
  }
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x68c721);
  cVar2 = charToLower('\0');
  switch(cVar2) {
  case 'b':
  case 'c':
  case 'd':
  case 'h':
  case 'o':
  case 'x':
    bVar1 = Type::isIntegral((Type *)in_stack_ffffffffffffff50);
    if ((bVar1) || (bVar1 = Type::isString((Type *)0x68c77d), bVar1)) {
      return true;
    }
    bVar1 = Type::isFloating((Type *)0x68c79d);
    if (bVar1) {
      range_03.endLoc = in_stack_ffffffffffffffa8;
      range_03.startLoc = in_stack_ffffffffffffffa0;
      EvalContext::addDiag
                ((EvalContext *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 SUB84((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20,0),range_03);
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_ffffffffffffffa0,
                 (char)((uint)in_stack_ffffffffffffff9c >> 0x18));
      range_00.endLoc = in_stack_ffffffffffffff60;
      range_00.startLoc = in_stack_ffffffffffffff58;
      Diagnostic::operator<<(in_stack_ffffffffffffff50,range_00);
      return true;
    }
    break;
  case 'e':
  case 'f':
  case 'g':
  case 't':
    bVar1 = Type::isNumeric((Type *)in_stack_ffffffffffffff50);
    if (bVar1) {
      return true;
    }
    break;
  default:
    break;
  case 'p':
    bVar1 = Type::isVoid((Type *)0x68c929);
    if (!bVar1) {
      return true;
    }
    break;
  case 's':
    bVar1 = Type::canBeStringLike((Type *)in_stack_ffffffffffffff50);
    if (bVar1) {
      return true;
    }
    break;
  case 'u':
  case 'z':
    bVar1 = isValidForRaw(in_stack_ffffffffffffffb8);
    if (bVar1) {
      return true;
    }
    break;
  case 'v':
    bVar1 = Type::isIntegral((Type *)in_stack_ffffffffffffff50);
    if (bVar1) {
      bVar3 = Type::getBitWidth((Type *)in_stack_ffffffffffffff58);
      if (1 < bVar3) {
        range_04.endLoc = in_stack_ffffffffffffffa8;
        range_04.startLoc = in_stack_ffffffffffffffa0;
        EvalContext::addDiag
                  ((EvalContext *)CONCAT44(0x2c000b,in_stack_ffffffffffffff98),code,range_04);
        range_01.endLoc = in_stack_ffffffffffffff60;
        range_01.startLoc = in_stack_ffffffffffffff58;
        Diagnostic::operator<<(in_stack_ffffffffffffff50,range_01);
      }
      return true;
    }
  }
  SVar4 = *(SourceLocation *)(in_RSI + 0x20);
  range_05.endLoc = in_stack_ffffffffffffffa8;
  range_05.startLoc = in_stack_ffffffffffffffa0;
  EvalContext::addDiag
            ((EvalContext *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),code,
             range_05);
  operator<<((Diagnostic *)in_stack_ffffffffffffffa0,
             (Type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Diagnostic::operator<<
            ((Diagnostic *)in_stack_ffffffffffffffa0,(char)((uint)in_stack_ffffffffffffff9c >> 0x18)
            );
  range_02.endLoc = SVar4;
  range_02.startLoc = in_R8;
  Diagnostic::operator<<(in_RCX,range_02);
  return false;
}

Assistant:

static bool checkArgType(TContext& context, const Expression& arg, char spec, SourceRange range) {
    if (arg.bad())
        return false;

    auto& type = *arg.type;
    switch (charToLower(spec)) {
        case 'h':
        case 'x':
        case 'd':
        case 'o':
        case 'b':
        case 'c':
            if (type.isIntegral() || type.isString())
                return true;
            if (type.isFloating()) {
                // Just a warning, we will implicitly convert.
                context.addDiag(diag::FormatRealInt, arg.sourceRange) << spec << range;
                return true;
            }
            break;
        case 'e':
        case 'f':
        case 'g':
        case 't':
            if (type.isNumeric())
                return true;
            break;
        case 'v':
            if (type.isIntegral()) {
                if (type.getBitWidth() > 1)
                    context.addDiag(diag::FormatMultibitStrength, arg.sourceRange) << range;
                return true;
            }
            break;
        case 'u':
        case 'z':
            if (isValidForRaw(type))
                return true;
            break;
        case 'p':
            if (!type.isVoid())
                return true;
            break;
        case 's':
            if (type.canBeStringLike())
                return true;
            break;
        default:
            break;
    }

    context.addDiag(diag::FormatMismatchedType, arg.sourceRange) << type << spec << range;
    return false;
}